

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataCollection::InitializeChunk
          (TupleDataCollection *this,DataChunk *chunk,vector<unsigned_long,_true> *columns)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  TupleDataAllocator *pTVar5;
  undefined4 extraout_var;
  size_type __n;
  vector<duckdb::LogicalType,_true> chunk_types;
  allocator_type local_49;
  vector<duckdb::LogicalType,_true> local_48;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,
             (long)(columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_49);
  if ((columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<unsigned_long,_true>::operator[](columns,__n);
      pvVar3 = vector<duckdb::LogicalType,_true>::operator[](&this->layout->types,*pvVar2);
      pvVar4 = vector<duckdb::LogicalType,_true>::operator[](&local_48,__n);
      if (pvVar4 != pvVar3) {
        pvVar4->id_ = pvVar3->id_;
        pvVar4->physical_type_ = pvVar3->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar4->type_info_,&pvVar3->type_info_);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(columns->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(columns->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pTVar5 = shared_ptr<duckdb::TupleDataAllocator,_true>::operator->(&this->allocator);
  iVar1 = (*pTVar5->buffer_manager->_vptr_BufferManager[0x14])();
  DataChunk::Initialize(chunk,(Allocator *)CONCAT44(extraout_var,iVar1),&local_48,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  return;
}

Assistant:

void TupleDataCollection::InitializeChunk(DataChunk &chunk, const vector<column_t> &columns) const {
	vector<LogicalType> chunk_types(columns.size());
	// keep the order of the columns
	for (idx_t i = 0; i < columns.size(); i++) {
		auto column_idx = columns[i];
		D_ASSERT(column_idx < layout.ColumnCount());
		chunk_types[i] = layout.GetTypes()[column_idx];
	}
	chunk.Initialize(allocator->GetAllocator(), chunk_types);
}